

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O1

void __thiscall FCompileContext::HandleJumps(FCompileContext *this,int token,FxExpression *handler)

{
  FxJumpStatement **ppFVar1;
  FxJumpStatement *pFVar2;
  uint uVar3;
  uint uVar4;
  
  if ((this->Jumps).Count != 0) {
    uVar4 = 0;
    do {
      ppFVar1 = (this->Jumps).Array;
      pFVar2 = ppFVar1[uVar4];
      if (*(int *)&(pFVar2->super_FxExpression).field_0x34 == token) {
        pFVar2->AddressResolver = handler;
        TArray<FxJumpStatement_*,_FxJumpStatement_*>::Grow(&handler->JumpAddresses,1);
        uVar3 = (handler->JumpAddresses).Count;
        (handler->JumpAddresses).Array[uVar3] = ppFVar1[uVar4];
        (handler->JumpAddresses).Count = uVar3 + 1;
        uVar3 = (this->Jumps).Count;
        if (uVar4 < uVar3) {
          uVar3 = uVar3 - 1;
          (this->Jumps).Count = uVar3;
          if (uVar4 <= uVar3 && uVar3 - uVar4 != 0) {
            ppFVar1 = (this->Jumps).Array;
            memmove(ppFVar1 + uVar4,ppFVar1 + (ulong)uVar4 + 1,(ulong)(uVar3 - uVar4) << 3);
          }
        }
        uVar4 = uVar4 - 1;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < (this->Jumps).Count);
  }
  return;
}

Assistant:

void FCompileContext::HandleJumps(int token, FxExpression *handler)
{
	for (unsigned int i = 0; i < Jumps.Size(); i++)
	{
		if (Jumps[i]->Token == token)
		{
			Jumps[i]->AddressResolver = handler;
			handler->JumpAddresses.Push(Jumps[i]);
			Jumps.Delete(i);
			i--;
		}
	}
}